

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.h
# Opt level: O1

bool __thiscall
Clasp::ShortImplicationsGraph::forEach<Clasp::ShortImplicationsGraph::ReverseArc>
          (ShortImplicationsGraph *this,Literal p,ReverseArc *op)

{
  pointer pIVar1;
  Literal x;
  pointer pIVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  Literal *pLVar9;
  ulong uVar10;
  __pointer_type pBVar11;
  
  uVar5 = p.rep_ >> 1;
  pIVar2 = (this->graph_).ebo_.buf;
  pIVar1 = pIVar2 + uVar5;
  if (((pIVar2[uVar5].super_ImpListBase.super_type.
        super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_ == 0)
      && (pIVar2[uVar5].super_ImpListBase.super_type.
          super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ ==
          (*(uint *)&pIVar2[uVar5].super_ImpListBase.super_type.
                     super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                     .field_0x8 & 0x7fffffff))) &&
     ((pIVar1->learnt)._M_b._M_p == (__pointer_type)0x0)) {
    bVar3 = true;
  }
  else {
    lVar7 = (long)(pIVar1->super_ImpListBase).super_type.
                  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                  buf_;
    uVar5 = (pIVar1->super_ImpListBase).super_type.
            super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_;
    uVar10 = (ulong)(pIVar1->super_ImpListBase).super_type.
                    super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                    .left_;
    if (uVar10 != 0) {
      uVar8 = 0;
      do {
        bVar3 = ReverseArc::unary(op,p,(Literal)*(uint32 *)(lVar7 + uVar8));
        if (!bVar3) goto LAB_001635cd;
        uVar8 = uVar8 + 4;
      } while (uVar10 != uVar8);
    }
    lVar6 = (ulong)(*(uint *)&(pIVar1->super_ImpListBase).super_type.
                              super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                              .field_0x8 & 0x7fffffff) +
            (long)(pIVar1->super_ImpListBase).super_type.
                  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                  buf_;
    do {
      if (lVar6 == lVar7 + (ulong)uVar5) {
        pBVar11 = (pIVar1->learnt)._M_b._M_p;
        bVar3 = pBVar11 == (__pointer_type)0x0;
        if (bVar3) {
          return bVar3;
        }
        do {
          pLVar9 = pBVar11->data;
          uVar5 = (pBVar11->size_lock).super___atomic_base<unsigned_int>._M_i;
          while (pLVar9 != pBVar11->data + (uVar5 >> 1)) {
            x.rep_ = pLVar9->rep_;
            if ((x.rep_ & 1) == 0) {
              bVar4 = ReverseArc::binary(op,(Literal)(p.rep_ | 1),x,(Literal)pLVar9[1].rep_);
              lVar7 = 8;
            }
            else {
              bVar4 = ReverseArc::unary(op,(Literal)(p.rep_ | 1),x);
              lVar7 = 4;
            }
            pLVar9 = (Literal *)((long)&pLVar9->rep_ + lVar7);
            if (bVar4 == false) {
              return bVar3;
            }
          }
          pBVar11 = (pBVar11->next)._M_b._M_p;
          bVar3 = pBVar11 == (__pointer_type)0x0;
          if (bVar3) {
            return bVar3;
          }
        } while( true );
      }
      bVar3 = ReverseArc::binary(op,p,(Literal)*(uint32 *)(lVar6 + -8),
                                 (Literal)*(uint32 *)(lVar6 + -4));
      lVar6 = lVar6 + -8;
    } while (bVar3);
LAB_001635cd:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool forEach(Literal p, const OP& op) const {
		const ImplicationList& x = graph_[p.id()];
		if (x.empty()) return true;
		ImplicationList::const_right_iterator rEnd = x.right_end(); // prefetch
		for (ImplicationList::const_left_iterator it = x.left_begin(), end = x.left_end(); it != end; ++it) {
			if (!op.unary(p, *it)) { return false; }
		}
		for (ImplicationList::const_right_iterator it = x.right_begin(); it != rEnd; ++it) {
			if (!op.binary(p, it->first, it->second)) { return false; }
		}
#if CLASP_HAS_THREADS
		for (Block* b = (x).learnt; b ; b = b->next) {
			p.flag(); bool r = true;
			for (Block::const_iterator imp = b->begin(), endOf = b->end(); imp != endOf; ) {
				if (!imp->flagged()) { r = op.binary(p, imp[0], imp[1]); imp += 2; }
				else                 { r = op.unary(p, imp[0]);          imp += 1; }
				if (!r)              { return false; }
			}
		}
#endif
		return true;
	}